

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * __thiscall
google::protobuf::Reflection::GetRepeatedString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field,
          int index)

{
  byte bVar1;
  pointer pcVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  RepeatedField<absl::lts_20250127::Cord> *this_00;
  const_reference this_01;
  RepeatedPtrFieldBase *this_02;
  string *psVar5;
  Nonnull<const_char_*> pcVar6;
  bool v1;
  char *description;
  Descriptor *pDVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar7 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar7,MVar8.descriptor,field,"GetRepeatedString");
  }
  pDVar7 = this->descriptor_;
  if (field->containing_type_ == pDVar7) {
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetRepeatedString",CPPTYPE_STRING);
        }
        if ((field->field_0x1 & 8) == 0) {
          CVar3 = FieldDescriptor::cpp_string_type(field);
          if ((CVar3 != kView) && (CVar3 != kString)) {
            if (CVar3 == kCord) {
              this_00 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                                  (this,message,field);
              this_01 = RepeatedField<absl::lts_20250127::Cord>::Get(this_00,index);
              absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_01);
              return __return_storage_ptr__;
            }
            GetRepeatedString_abi_cxx11_();
          }
          this_02 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               (this,message,field)->super_RepeatedPtrFieldBase;
          psVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (this_02,index);
        }
        else {
          uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          psVar5 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4)
                              ,field->number_,index);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar5->_M_string_length);
        return __return_storage_ptr__;
      }
    }
    else {
      GetRepeatedString_abi_cxx11_();
    }
    pDVar7 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar7,field,"GetRepeatedString",description);
}

Assistant:

std::string Reflection::GetRepeatedString(const Message& message,
                                          const FieldDescriptor* field,
                                          int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        return std::string(GetRepeatedField<absl::Cord>(message, field, index));
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}